

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psftp.c
# Opt level: O0

_Bool sftp_recvdata(char *buf,size_t len)

{
  int iVar1;
  size_t sVar2;
  size_t got;
  size_t len_local;
  char *buf_local;
  
  got = len;
  len_local = (size_t)buf;
  do {
    if (got == 0) {
      return true;
    }
    while (sVar2 = bufchain_size(&received_data), sVar2 == 0) {
      iVar1 = backend_exitcode(backend);
      if ((-1 < iVar1) || (iVar1 = ssh_sftp_loop_iteration(), iVar1 < 0)) {
        return false;
      }
    }
    sVar2 = bufchain_fetch_consume_up_to(&received_data,(void *)len_local,got);
    len_local = sVar2 + len_local;
    got = got - sVar2;
  } while( true );
}

Assistant:

bool sftp_recvdata(char *buf, size_t len)
{
    while (len > 0) {
        while (bufchain_size(&received_data) == 0) {
            if (backend_exitcode(backend) >= 0 ||
                ssh_sftp_loop_iteration() < 0)
                return false;          /* doom */
        }

        size_t got = bufchain_fetch_consume_up_to(&received_data, buf, len);
        buf += got;
        len -= got;
    }

    return true;
}